

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTi.cpp
# Opt level: O0

void __thiscall OpenMD::NPTi::scaleSimBox(NPTi *this)

{
  RectMatrix<double,_3U,_3U> *in_RDI;
  Mat3x3d *in_stack_00000018;
  Mat3x3d hmat;
  RealType scaleFactor;
  Snapshot *this_00;
  pointer local_10;
  
  local_10 = (pointer)exp(in_RDI->data_[0][1] * in_RDI[7].data_[0][2]);
  if ((1.1 < (double)local_10) || ((double)local_10 < 0.9)) {
    snprintf(painCave.errMsg,2000,
             "NPTi error: Attempting a Box scaling of more than 10 percent check your tauBarostat, as it is probably too small!\n eta = %lf, scaleFactor = %lf\n"
             ,in_RDI[7].data_[0][2],local_10);
    painCave.isFatal = 1;
    simError();
  }
  else {
    this_00 = (Snapshot *)&stack0xffffffffffffffa8;
    Snapshot::getHmat(this_00);
    RectMatrix<double,_3U,_3U>::operator*=(in_RDI,(double)this_00);
    Snapshot::setHmat((Snapshot *)
                      hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                      [0],in_stack_00000018);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x25d281);
  }
  return;
}

Assistant:

void NPTi::scaleSimBox() {
    RealType scaleFactor;

    scaleFactor = exp(dt * eta);

    if ((scaleFactor > 1.1) || (scaleFactor < 0.9)) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "NPTi error: Attempting a Box scaling of more than 10 percent"
               " check your tauBarostat, as it is probably too small!\n"
               " eta = %lf, scaleFactor = %lf\n",
               eta, scaleFactor);
      painCave.isFatal = 1;
      simError();
    } else {
      Mat3x3d hmat = snap->getHmat();
      hmat *= scaleFactor;
      snap->setHmat(hmat);
    }
  }